

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-conv.c
# Opt level: O0

_Bool enc_is_ascii_compatible(char *enc,GError **error)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  char *s;
  _Bool equal;
  GError **error_local;
  char *enc_local;
  
  if ((enc == (char *)0x0) || (*enc == '\0')) {
    g_return_if_fail_warning("rifiuti2","enc_is_ascii_compatible","enc && *enc");
    enc_local._7_1_ = false;
  }
  else {
    uVar3 = g_convert("C:\\",0xffffffffffffffff,"UTF-8",enc,0,0,error);
    iVar1 = g_strcmp0("C:\\",uVar3);
    g_free(uVar3);
    if (iVar1 == 0) {
      enc_local._7_1_ = true;
    }
    else {
      if (*error == (GError *)0x0) {
        uVar2 = g_convert_error_quark();
        g_set_error_literal(error,uVar2,1,"");
      }
      enc_local._7_1_ = false;
    }
  }
  return enc_local._7_1_;
}

Assistant:

bool
enc_is_ascii_compatible    (const char   *enc,
                            GError      **error)
{
    bool equal;
    char *s;

    g_return_val_if_fail (enc && *enc, false);

    s = g_convert ("C:\\", -1, "UTF-8", enc, NULL, NULL, error);
    equal = (0 == g_strcmp0 ("C:\\", (const char *)s));
    g_free (s);

    if (equal)
        return true;

    if (*error == NULL)
        // Encoding is ASCII incompatible (e.g. EBCDIC). Even if trial
        // convert doesn't fail, it would cause application error
        // later on. Treat that as conversion error for convenience.
        g_set_error_literal (error, G_CONVERT_ERROR,
            G_CONVERT_ERROR_ILLEGAL_SEQUENCE, "");
    return false;
}